

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webm2pes.cc
# Opt level: O2

bool __thiscall libwebm::PesHeader::Write(PesHeader *this,bool write_pts,PacketDataBuffer *buffer)

{
  bool bVar1;
  int i;
  long lVar2;
  uint8_t byte;
  
  if (buffer == (PacketDataBuffer *)0x0) {
    fwrite("Webm2Pes: nullptr in header writer.\n",0x24,1,_stderr);
  }
  else {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (buffer,this->start_code + lVar2);
    }
    if ((ulong)this->packet_length < 0xfff7) {
      lVar2 = (ulong)this->packet_length + 9;
      byte = (uint8_t)((ulong)lVar2 >> 8);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(buffer,&byte);
      byte = (uint8_t)lVar2;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back(buffer,&byte);
      bVar1 = PesOptionalHeader::Write(&this->optional_header,write_pts,buffer);
      if (bVar1) {
        return bVar1;
      }
      fwrite("Webm2Pes: PES optional header write failed.",0x2b,1,_stderr);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool PesHeader::Write(bool write_pts, PacketDataBuffer* buffer) const {
  if (buffer == nullptr) {
    std::fprintf(stderr, "Webm2Pes: nullptr in header writer.\n");
    return false;
  }

  // Write |start_code|.
  const int kStartCodeLength = 4;
  for (int i = 0; i < kStartCodeLength; ++i)
    buffer->push_back(start_code[i]);

  // The length field here reports number of bytes following the field. The
  // length of the optional header must be added to the payload length set by
  // the user.
  const std::size_t header_length =
      packet_length + optional_header.size_in_bytes();
  if (header_length > UINT16_MAX)
    return false;

  // Write |header_length| as big endian.
  std::uint8_t byte = (header_length >> 8) & 0xff;
  buffer->push_back(byte);
  byte = header_length & 0xff;
  buffer->push_back(byte);

  // Write the (not really) optional header.
  if (optional_header.Write(write_pts, buffer) != true) {
    std::fprintf(stderr, "Webm2Pes: PES optional header write failed.");
    return false;
  }
  return true;
}